

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rest.cpp
# Opt level: O3

bool rest_filter_header(any *context,HTTPRequest *req,string *strURIPart)

{
  pointer pcVar1;
  int iVar2;
  pointer ppCVar3;
  UniValue val;
  span<const_std::byte,_18446744073709551615UL> reply;
  span<const_std::byte,_18446744073709551615UL> reply_00;
  undefined8 __n;
  bool bVar4;
  char cVar5;
  RESTResponseFormat RVar6;
  long lVar7;
  BlockFilterIndex *this;
  ChainstateManager *this_00;
  Chainstate *pCVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar9;
  undefined8 uVar10;
  CBlockIndex *pCVar11;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar12;
  uint256 *puVar13;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R8;
  CBlockIndex **ppCVar14;
  uint256 *this_01;
  char *pcVar15;
  long in_FS_OFFSET;
  bool bVar16;
  Span<const_unsigned_char> s;
  string_view str;
  span<const_std::byte,_18446744073709551615UL> reply_01;
  __integer_from_chars_result_type<unsigned_long> _Var17;
  string_view separators;
  vector<uint256,_std::allocator<uint256>_> filter_headers;
  vector<const_CBlockIndex_*,_std::allocator<const_CBlockIndex_*>_> headers;
  BlockFilterType filtertype;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  uri_parts;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock9;
  optional<uint256> block_hash;
  CBlockIndex *pindex;
  string raw_blockhash;
  string raw_count;
  string param;
  undefined1 in_stack_fffffffffffffca8 [15];
  iterator __position;
  uint256 *puVar18;
  uint256 *puVar19;
  undefined8 in_stack_fffffffffffffcd0;
  CBlockIndex **ppCVar20;
  iterator __position_00;
  CBlockIndex **ppCVar21;
  CBlockIndex **ppCVar22;
  undefined7 in_stack_fffffffffffffcf0;
  BlockFilterType in_stack_fffffffffffffcf7;
  pointer in_stack_fffffffffffffcf8;
  pointer local_300;
  string local_2f0;
  UniValue local_2d0;
  undefined1 *local_278;
  undefined8 local_270;
  undefined1 local_268 [15];
  char local_259;
  undefined1 local_258 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_240;
  pointer local_230;
  pointer pbStack_228;
  pointer local_220;
  pointer pUStack_218;
  pointer local_210;
  pointer pUStack_208;
  string local_200;
  undefined1 local_1e0 [32];
  string local_1c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_180;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_160;
  undefined1 local_140 [32];
  bool local_120;
  string local_118;
  string local_f8 [2];
  string local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  string local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  bVar4 = CheckWarmup(req);
  if (!bVar4) {
    bVar4 = false;
    goto LAB_00982bd8;
  }
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  local_58._M_string_length = 0;
  local_58.field_2._M_local_buf[0] = '\0';
  RVar6 = ParseDataFormat(&local_58,strURIPart);
  local_258._0_8_ = local_58._M_dataplus._M_p;
  local_258._8_8_ = local_58._M_string_length;
  local_140[0] = '/';
  separators._M_str = (char *)in_R8;
  separators._M_len = (size_t)local_140;
  util::Split<std::__cxx11::string>
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&stack0xfffffffffffffcf8,(util *)local_258,(Span<const_char> *)0x1,separators);
  local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
  local_78._M_string_length = 0;
  local_78.field_2._M_local_buf[0] = '\0';
  local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
  local_98._M_string_length = 0;
  local_98.field_2._M_local_buf[0] = '\0';
  lVar7 = (long)local_300 - (long)in_stack_fffffffffffffcf8 >> 5;
  if (lVar7 == 3) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
              (&local_98,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &in_stack_fffffffffffffcf8->values);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
              (&local_78,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ((long)&(in_stack_fffffffffffffcf8->val).field_2 + 8));
LAB_0098262c:
    pcVar15 = local_78._M_dataplus._M_p + local_78._M_string_length;
    uVar10 = 0;
    _Var17 = std::from_chars<unsigned_long>
                       (local_78._M_dataplus._M_p,pcVar15,(unsigned_long *)local_258,10);
    __n = local_258._0_8_;
    bVar4 = _Var17.ptr != pcVar15;
    bVar16 = _Var17.ec != 0;
    str._M_str._1_7_ = (undefined7)((ulong)uVar10 >> 8);
    str._M_str._0_1_ = bVar16 || bVar4;
    if ((pointer)(local_258._0_8_ - 0x7d1) < (pointer)0xfffffffffffff830 || (bVar16 || bVar4)) {
      tinyformat::format<unsigned_int,std::__cxx11::string>
                (&local_118,
                 (tinyformat *)"Header count is invalid or out of acceptable range (1-%u): %s",
                 (char *)&MAX_REST_HEADERS_RESULTS,(uint *)&local_78,in_R8);
      RESTERR(req,HTTP_BAD_REQUEST,&local_118);
      local_160.field_2._M_allocated_capacity = local_118.field_2._M_allocated_capacity;
      local_160._M_dataplus._M_p = local_118._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_118._M_dataplus._M_p != &local_118.field_2) {
LAB_00982b5d:
        operator_delete(local_160._M_dataplus._M_p,local_160.field_2._M_allocated_capacity + 1);
      }
      goto LAB_00982b65;
    }
    str._M_len = (size_t)local_98._M_dataplus._M_p;
    detail::FromHex<uint256>((optional<uint256> *)local_140,(detail *)local_98._M_string_length,str)
    ;
    if (local_120 == false) {
      std::operator+(&local_160,"Invalid hash: ",&local_98);
      RESTERR(req,HTTP_BAD_REQUEST,&local_160);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_160._M_dataplus._M_p != &local_160.field_2) goto LAB_00982b5d;
      goto LAB_00982b65;
    }
    bVar4 = BlockFilterTypeByName((string *)in_stack_fffffffffffffcf8,&stack0xfffffffffffffcf7);
    if (!bVar4) {
      std::operator+(&local_180,"Unknown filtertype ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffcf8);
      RESTERR(req,HTTP_BAD_REQUEST,&local_180);
      local_160.field_2._M_allocated_capacity = local_180.field_2._M_allocated_capacity;
      local_160._M_dataplus._M_p = local_180._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_180._M_dataplus._M_p != &local_180.field_2) goto LAB_00982b5d;
      goto LAB_00982b65;
    }
    this = GetBlockFilterIndex(in_stack_fffffffffffffcf7);
    if (this == (BlockFilterIndex *)0x0) {
      std::operator+(&local_1a0,"Index is not enabled for filtertype ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffcf8);
      RESTERR(req,HTTP_BAD_REQUEST,&local_1a0);
      local_160.field_2._M_allocated_capacity = local_1a0.field_2._M_allocated_capacity;
      local_160._M_dataplus._M_p = local_1a0._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a0._M_dataplus._M_p != &local_1a0.field_2) goto LAB_00982b5d;
      goto LAB_00982b65;
    }
    ppCVar14 = (CBlockIndex **)0x0;
    __position_00._M_current = (CBlockIndex **)0x0;
    ppCVar22 = (CBlockIndex **)0x0;
    std::vector<const_CBlockIndex_*,_std::allocator<const_CBlockIndex_*>_>::reserve
              ((vector<const_CBlockIndex_*,_std::allocator<const_CBlockIndex_*>_> *)
               &stack0xfffffffffffffcd8,__n);
    this_00 = GetChainman(context,req);
    if (this_00 == (ChainstateManager *)0x0) {
      bVar4 = false;
    }
    else {
      local_258._0_8_ = &cs_main;
      local_258._8_8_ = local_258._8_8_ & 0xffffffffffffff00;
      std::unique_lock<std::recursive_mutex>::lock((unique_lock<std::recursive_mutex> *)local_258);
      pCVar8 = ChainstateManager::ActiveChainstate(this_00);
      local_b8._M_dataplus._M_p =
           (pointer)node::BlockManager::LookupBlockIndex(&this_00->m_blockman,(uint256 *)local_140);
      for (; (CBlockIndex *)local_b8._M_dataplus._M_p != (CBlockIndex *)0x0;
          local_b8._M_dataplus._M_p =
               (pointer)CChain::Next(&pCVar8->m_chain,local_b8._M_dataplus._M_p)) {
        iVar2 = ((CBlockIndex *)local_b8._M_dataplus._M_p)->nHeight;
        if (((long)iVar2 < 0) ||
           (ppCVar3 = (pCVar8->m_chain).vChain.
                      super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
                      super__Vector_impl_data._M_start,
           (int)((ulong)((long)(pCVar8->m_chain).vChain.
                               super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>.
                               _M_impl.super__Vector_impl_data._M_finish - (long)ppCVar3) >> 3) <=
           iVar2)) {
          pCVar11 = (CBlockIndex *)0x0;
        }
        else {
          pCVar11 = ppCVar3[iVar2];
        }
        if (pCVar11 != (CBlockIndex *)local_b8._M_dataplus._M_p) break;
        if (__position_00._M_current == ppCVar22) {
          std::vector<CBlockIndex_const*,std::allocator<CBlockIndex_const*>>::
          _M_realloc_insert<CBlockIndex_const*const&>
                    ((vector<CBlockIndex_const*,std::allocator<CBlockIndex_const*>> *)
                     &stack0xfffffffffffffcd8,__position_00,(CBlockIndex **)&local_b8);
        }
        else {
          *__position_00._M_current = (CBlockIndex *)local_b8._M_dataplus._M_p;
          __position_00._M_current = __position_00._M_current + 1;
        }
        if ((pointer)((long)__position_00._M_current - (long)ppCVar14 >> 3) == (pointer)__n) break;
      }
      std::unique_lock<std::recursive_mutex>::~unique_lock
                ((unique_lock<std::recursive_mutex> *)local_258);
      cVar5 = BaseIndex::BlockUntilSyncedToCurrentChain(&this->super_BaseIndex);
      this_01 = (uint256 *)0x0;
      __position._M_current = (uint256 *)0x0;
      puVar19 = (uint256 *)0x0;
      std::vector<uint256,_std::allocator<uint256>_>::reserve
                ((vector<uint256,_std::allocator<uint256>_> *)&stack0xfffffffffffffcb8,__n);
      ppCVar20 = ppCVar14;
      ppCVar21 = __position_00._M_current;
      if (ppCVar14 != __position_00._M_current) {
        do {
          local_258._16_8_ = 0;
          aStack_240._M_local_buf[0] = '\0';
          aStack_240._M_allocated_capacity._1_7_ = 0;
          local_258._0_8_ = (pointer)0x0;
          local_258._8_8_ =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)0x0;
          bVar4 = BlockFilterIndex::LookupFilterHeader(this,*ppCVar14,(uint256 *)local_258);
          if (!bVar4) {
            local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_b8,"Filter not found.","");
            pcVar15 = " Block filters are still in the process of being indexed.";
            if (cVar5 != '\0') {
              pcVar15 = " This error is unexpected and indicates index corruption.";
            }
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                      (&local_b8,pcVar15);
            local_1c0._M_dataplus._M_p = (pointer)&local_1c0.field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_1c0,local_b8._M_dataplus._M_p,
                       local_b8._M_dataplus._M_p + local_b8._M_string_length);
            RESTERR(req,HTTP_NOT_FOUND,&local_1c0);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
              operator_delete(local_1c0._M_dataplus._M_p,local_1c0.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_b8._M_dataplus._M_p == &local_b8.field_2) goto LAB_00982ce1;
            goto LAB_00982cd1;
          }
          if (__position._M_current == puVar19) {
            std::vector<uint256,std::allocator<uint256>>::_M_realloc_insert<uint256_const&>
                      ((vector<uint256,std::allocator<uint256>> *)&stack0xfffffffffffffcb8,
                       __position,(uint256 *)local_258);
          }
          else {
            *(undefined8 *)(((__position._M_current)->super_base_blob<256U>).m_data._M_elems + 0x10)
                 = local_258._16_8_;
            *(ulong *)(((__position._M_current)->super_base_blob<256U>).m_data._M_elems + 0x18) =
                 CONCAT71(aStack_240._M_allocated_capacity._1_7_,aStack_240._M_local_buf[0]);
            *(undefined8 *)((__position._M_current)->super_base_blob<256U>).m_data._M_elems =
                 local_258._0_8_;
            *(undefined8 *)(((__position._M_current)->super_base_blob<256U>).m_data._M_elems + 8) =
                 local_258._8_8_;
            __position._M_current = __position._M_current + 1;
          }
          ppCVar14 = ppCVar14 + 1;
        } while (ppCVar14 != __position_00._M_current);
      }
      if (RVar6 == JSON) {
        local_278 = local_268;
        local_258._8_8_ = &aStack_240;
        local_258._0_4_ = 2;
        aStack_240._M_local_buf[0] = '\0';
        aStack_240._M_allocated_capacity._1_7_ = (undefined7)local_268._1_8_;
        aStack_240._M_local_buf[8] = SUB81(local_268._1_8_,7);
        aStack_240._9_4_ = local_268._9_4_;
        aStack_240._13_2_ = local_268._13_2_;
        aStack_240._M_local_buf[0xf] = local_259;
        local_258._16_8_ = 0;
        local_270 = 0;
        local_268[0] = 0;
        local_230 = (pointer)0x0;
        pbStack_228 = (pointer)0x0;
        local_220 = (pointer)0x0;
        pUStack_218 = (pointer)0x0;
        local_210 = (pointer)0x0;
        pUStack_208 = (pointer)0x0;
        puVar13 = this_01;
        if (this_01 != __position._M_current) {
          puVar18 = __position._M_current;
          do {
            base_blob<256u>::GetHex_abi_cxx11_(&local_b8,this_01);
            UniValue::
            UniValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                      (&local_2d0,&local_b8);
            val.val._M_dataplus._M_p._7_1_ = cVar5;
            val._0_15_ = in_stack_fffffffffffffca8;
            val.val._M_string_length = (size_type)puVar13;
            val.val.field_2._M_allocated_capacity = (size_type)puVar18;
            val.val.field_2._8_8_ = puVar19;
            val.keys.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffffcd0;
            val.keys.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)ppCVar20;
            val.keys.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)ppCVar21;
            val.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)ppCVar22;
            val.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
            super__Vector_impl_data._M_finish._0_7_ = in_stack_fffffffffffffcf0;
            val.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
            super__Vector_impl_data._M_finish._7_1_ = in_stack_fffffffffffffcf7;
            val.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = in_stack_fffffffffffffcf8;
            UniValue::push_back((UniValue *)local_258,val);
            std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_2d0.values);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector(&local_2d0.keys);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2d0.val._M_dataplus._M_p != &local_2d0.val.field_2) {
              operator_delete(local_2d0.val._M_dataplus._M_p,
                              local_2d0.val.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
              operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
            }
            this_01 = this_01 + 1;
          } while (this_01 != __position._M_current);
        }
        UniValue::write_abi_cxx11_((UniValue *)local_1e0,(int)local_258,(void *)0x0,0);
        pbVar9 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_1e0,"\n");
        local_b8._M_dataplus._M_p = (pbVar9->_M_dataplus)._M_p;
        paVar12 = &pbVar9->field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b8._M_dataplus._M_p == paVar12) {
          local_b8.field_2._M_allocated_capacity = paVar12->_M_allocated_capacity;
          local_b8.field_2._8_8_ = *(undefined8 *)((long)&pbVar9->field_2 + 8);
          local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
        }
        else {
          local_b8.field_2._M_allocated_capacity = paVar12->_M_allocated_capacity;
        }
        local_b8._M_string_length = pbVar9->_M_string_length;
        (pbVar9->_M_dataplus)._M_p = (pointer)paVar12;
        pbVar9->_M_string_length = 0;
        (pbVar9->field_2)._M_local_buf[0] = '\0';
        pcVar1 = local_1e0 + 0x10;
        this_01 = puVar13;
        if ((pointer)local_1e0._0_8_ != pcVar1) {
          operator_delete((void *)local_1e0._0_8_,local_1e0._16_8_ + 1);
          this_01 = puVar13;
        }
        local_1e0._0_8_ = pcVar1;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_1e0,"Content-Type","");
        local_200._M_dataplus._M_p = (pointer)&local_200.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_200,"application/json","");
        HTTPRequest::WriteHeader(req,(string *)local_1e0,&local_200);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_200._M_dataplus._M_p != &local_200.field_2) {
          operator_delete(local_200._M_dataplus._M_p,local_200.field_2._M_allocated_capacity + 1);
        }
        if ((pointer)local_1e0._0_8_ != pcVar1) {
          operator_delete((void *)local_1e0._0_8_,local_1e0._16_8_ + 1);
        }
        reply_00._M_extent._M_extent_value = local_b8._M_string_length;
        reply_00._M_ptr = (pointer)local_b8._M_dataplus._M_p;
        HTTPRequest::WriteReply(req,200,reply_00);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
          operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
        }
        UniValue::~UniValue((UniValue *)local_258);
LAB_00983343:
        bVar4 = true;
      }
      else {
        if (RVar6 == HEX) {
          local_258._16_8_ = 0;
          aStack_240._M_local_buf[0] = '\0';
          aStack_240._M_allocated_capacity._1_7_ = 0;
          local_258._0_8_ = (pointer)0x0;
          local_258._8_8_ =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)0x0;
          puVar13 = this_01;
          while (puVar13 != __position._M_current) {
            std::vector<std::byte,zero_after_free_allocator<std::byte>>::
            _M_range_insert<std::byte_const*>
                      ((vector<std::byte,zero_after_free_allocator<std::byte>> *)local_258,
                       local_258._8_8_,puVar13,puVar13 + 1);
            puVar13 = puVar13 + 1;
          }
          s.m_data = (uchar *)(local_258._0_8_ +
                              CONCAT71(aStack_240._M_allocated_capacity._1_7_,
                                       aStack_240._M_local_buf[0]));
          s.m_size = local_258._8_8_ - (long)s.m_data;
          HexStr_abi_cxx11_((string *)local_1e0,s);
          pbVar9 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                   append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_1e0,"\n");
          local_b8._M_dataplus._M_p = (pbVar9->_M_dataplus)._M_p;
          paVar12 = &pbVar9->field_2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b8._M_dataplus._M_p == paVar12) {
            local_b8.field_2._M_allocated_capacity = paVar12->_M_allocated_capacity;
            local_b8.field_2._8_8_ = *(undefined8 *)((long)&pbVar9->field_2 + 8);
            local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
          }
          else {
            local_b8.field_2._M_allocated_capacity = paVar12->_M_allocated_capacity;
          }
          local_b8._M_string_length = pbVar9->_M_string_length;
          (pbVar9->_M_dataplus)._M_p = (pointer)paVar12;
          pbVar9->_M_string_length = 0;
          (pbVar9->field_2)._M_local_buf[0] = '\0';
          pcVar1 = local_1e0 + 0x10;
          if ((pointer)local_1e0._0_8_ != pcVar1) {
            operator_delete((void *)local_1e0._0_8_,local_1e0._16_8_ + 1);
          }
          local_1e0._0_8_ = pcVar1;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_1e0,"Content-Type","");
          local_200._M_dataplus._M_p = (pointer)&local_200.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_200,"text/plain","");
          HTTPRequest::WriteHeader(req,(string *)local_1e0,&local_200);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_200._M_dataplus._M_p != &local_200.field_2) {
            operator_delete(local_200._M_dataplus._M_p,local_200.field_2._M_allocated_capacity + 1);
          }
          if ((pointer)local_1e0._0_8_ != pcVar1) {
            operator_delete((void *)local_1e0._0_8_,local_1e0._16_8_ + 1);
          }
          reply._M_extent._M_extent_value = local_b8._M_string_length;
          reply._M_ptr = (pointer)local_b8._M_dataplus._M_p;
          HTTPRequest::WriteReply(req,200,reply);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
            operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
          }
LAB_00983207:
          std::_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>::~_Vector_base
                    ((_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_> *)local_258);
          goto LAB_00983343;
        }
        if (RVar6 == BINARY) {
          local_258._16_8_ = 0;
          aStack_240._M_local_buf[0] = '\0';
          aStack_240._M_allocated_capacity._1_7_ = 0;
          local_258._0_8_ = (pointer)0x0;
          local_258._8_8_ =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)0x0;
          puVar13 = this_01;
          while (puVar13 != __position._M_current) {
            std::vector<std::byte,zero_after_free_allocator<std::byte>>::
            _M_range_insert<std::byte_const*>
                      ((vector<std::byte,zero_after_free_allocator<std::byte>> *)local_258,
                       local_258._8_8_,puVar13,puVar13 + 1);
            puVar13 = puVar13 + 1;
          }
          local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"Content-Type","");
          local_1e0._0_8_ = local_1e0 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_1e0,"application/octet-stream","");
          HTTPRequest::WriteHeader(req,&local_b8,(string *)local_1e0);
          if ((undefined1 *)local_1e0._0_8_ != local_1e0 + 0x10) {
            operator_delete((void *)local_1e0._0_8_,local_1e0._16_8_ + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
            operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
          }
          reply_01._M_ptr =
               (pointer)(local_258._0_8_ +
                        CONCAT71(aStack_240._M_allocated_capacity._1_7_,aStack_240._M_local_buf[0]))
          ;
          reply_01._M_extent._M_extent_value = local_258._8_8_ - (long)reply_01._M_ptr;
          HTTPRequest::WriteReply(req,200,reply_01);
          goto LAB_00983207;
        }
        AvailableDataFormatsString_abi_cxx11_();
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_258,"output format not found (available: ",&local_b8);
        pbVar9 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_258,")");
        local_2f0._M_dataplus._M_p = (pbVar9->_M_dataplus)._M_p;
        paVar12 = &pbVar9->field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2f0._M_dataplus._M_p == paVar12) {
          local_2f0.field_2._M_allocated_capacity = paVar12->_M_allocated_capacity;
          local_2f0.field_2._8_8_ = *(undefined8 *)((long)&pbVar9->field_2 + 8);
          local_2f0._M_dataplus._M_p = (pointer)&local_2f0.field_2;
        }
        else {
          local_2f0.field_2._M_allocated_capacity = paVar12->_M_allocated_capacity;
        }
        local_2f0._M_string_length = pbVar9->_M_string_length;
        (pbVar9->_M_dataplus)._M_p = (pointer)paVar12;
        pbVar9->_M_string_length = 0;
        (pbVar9->field_2)._M_local_buf[0] = '\0';
        RESTERR(req,HTTP_NOT_FOUND,&local_2f0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2f0._M_dataplus._M_p != &local_2f0.field_2) {
          operator_delete(local_2f0._M_dataplus._M_p,local_2f0.field_2._M_allocated_capacity + 1);
        }
        if ((undefined1 *)local_258._0_8_ != local_258 + 0x10) {
          operator_delete((void *)local_258._0_8_,local_258._16_8_ + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
LAB_00982cd1:
          operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
        }
LAB_00982ce1:
        bVar4 = false;
      }
      ppCVar14 = ppCVar20;
      if (this_01 != (uint256 *)0x0) {
        operator_delete(this_01,(long)puVar19 - (long)this_01);
        ppCVar14 = ppCVar20;
      }
    }
    if (ppCVar14 != (CBlockIndex **)0x0) {
      operator_delete(ppCVar14,(long)ppCVar22 - (long)ppCVar14);
    }
  }
  else {
    if (lVar7 == 2) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
                (&local_98,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&(in_stack_fffffffffffffcf8->val).field_2 + 8));
      local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"count","");
      HTTPRequest::GetQueryParameter
                ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_258,req,&local_b8);
      std::optional<std::__cxx11::string>::value_or<char_const(&)[2]>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_140,
                 (optional<std::__cxx11::string> *)local_258,(char (*) [2])0xe7f273);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                (&local_78,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_140);
      if ((undefined1 *)CONCAT71(local_140._1_7_,local_140[0]) != local_140 + 0x10) {
        operator_delete((undefined1 *)CONCAT71(local_140._1_7_,local_140[0]),local_140._16_8_ + 1);
      }
      if (((bool)aStack_240._M_local_buf[8] == true) &&
         (aStack_240._M_local_buf[8] = false, (undefined1 *)local_258._0_8_ != local_258 + 0x10)) {
        operator_delete((void *)local_258._0_8_,local_258._16_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
        operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
      }
      goto LAB_0098262c;
    }
    local_f8[0]._M_dataplus._M_p = (pointer)&local_f8[0].field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_f8,
               "Invalid URI format. Expected /rest/blockfilterheaders/<filtertype>/<blockhash>.<ext>?count=<count>"
               ,"");
    RESTERR(req,HTTP_BAD_REQUEST,local_f8);
    local_160.field_2._M_allocated_capacity = local_f8[0].field_2._M_allocated_capacity;
    local_160._M_dataplus._M_p = local_f8[0]._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8[0]._M_dataplus._M_p != &local_f8[0].field_2) goto LAB_00982b5d;
LAB_00982b65:
    bVar4 = false;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p,
                    CONCAT71(local_98.field_2._M_allocated_capacity._1_7_,
                             local_98.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p,
                    CONCAT71(local_78.field_2._M_allocated_capacity._1_7_,
                             local_78.field_2._M_local_buf[0]) + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&stack0xfffffffffffffcf8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,
                    CONCAT71(local_58.field_2._M_allocated_capacity._1_7_,
                             local_58.field_2._M_local_buf[0]) + 1);
  }
LAB_00982bd8:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return bVar4;
}

Assistant:

static bool rest_filter_header(const std::any& context, HTTPRequest* req, const std::string& strURIPart)
{
    if (!CheckWarmup(req)) return false;

    std::string param;
    const RESTResponseFormat rf = ParseDataFormat(param, strURIPart);

    std::vector<std::string> uri_parts = SplitString(param, '/');
    std::string raw_count;
    std::string raw_blockhash;
    if (uri_parts.size() == 3) {
        // deprecated path: /rest/blockfilterheaders/<filtertype>/<count>/<blockhash>
        raw_blockhash = uri_parts[2];
        raw_count = uri_parts[1];
    } else if (uri_parts.size() == 2) {
        // new path with query parameter: /rest/blockfilterheaders/<filtertype>/<blockhash>?count=<count>
        raw_blockhash = uri_parts[1];
        try {
            raw_count = req->GetQueryParameter("count").value_or("5");
        } catch (const std::runtime_error& e) {
            return RESTERR(req, HTTP_BAD_REQUEST, e.what());
        }
    } else {
        return RESTERR(req, HTTP_BAD_REQUEST, "Invalid URI format. Expected /rest/blockfilterheaders/<filtertype>/<blockhash>.<ext>?count=<count>");
    }

    const auto parsed_count{ToIntegral<size_t>(raw_count)};
    if (!parsed_count.has_value() || *parsed_count < 1 || *parsed_count > MAX_REST_HEADERS_RESULTS) {
        return RESTERR(req, HTTP_BAD_REQUEST, strprintf("Header count is invalid or out of acceptable range (1-%u): %s", MAX_REST_HEADERS_RESULTS, raw_count));
    }

    auto block_hash{uint256::FromHex(raw_blockhash)};
    if (!block_hash) {
        return RESTERR(req, HTTP_BAD_REQUEST, "Invalid hash: " + raw_blockhash);
    }

    BlockFilterType filtertype;
    if (!BlockFilterTypeByName(uri_parts[0], filtertype)) {
        return RESTERR(req, HTTP_BAD_REQUEST, "Unknown filtertype " + uri_parts[0]);
    }

    BlockFilterIndex* index = GetBlockFilterIndex(filtertype);
    if (!index) {
        return RESTERR(req, HTTP_BAD_REQUEST, "Index is not enabled for filtertype " + uri_parts[0]);
    }

    std::vector<const CBlockIndex*> headers;
    headers.reserve(*parsed_count);
    {
        ChainstateManager* maybe_chainman = GetChainman(context, req);
        if (!maybe_chainman) return false;
        ChainstateManager& chainman = *maybe_chainman;
        LOCK(cs_main);
        CChain& active_chain = chainman.ActiveChain();
        const CBlockIndex* pindex{chainman.m_blockman.LookupBlockIndex(*block_hash)};
        while (pindex != nullptr && active_chain.Contains(pindex)) {
            headers.push_back(pindex);
            if (headers.size() == *parsed_count)
                break;
            pindex = active_chain.Next(pindex);
        }
    }

    bool index_ready = index->BlockUntilSyncedToCurrentChain();

    std::vector<uint256> filter_headers;
    filter_headers.reserve(*parsed_count);
    for (const CBlockIndex* pindex : headers) {
        uint256 filter_header;
        if (!index->LookupFilterHeader(pindex, filter_header)) {
            std::string errmsg = "Filter not found.";

            if (!index_ready) {
                errmsg += " Block filters are still in the process of being indexed.";
            } else {
                errmsg += " This error is unexpected and indicates index corruption.";
            }

            return RESTERR(req, HTTP_NOT_FOUND, errmsg);
        }
        filter_headers.push_back(filter_header);
    }

    switch (rf) {
    case RESTResponseFormat::BINARY: {
        DataStream ssHeader{};
        for (const uint256& header : filter_headers) {
            ssHeader << header;
        }

        req->WriteHeader("Content-Type", "application/octet-stream");
        req->WriteReply(HTTP_OK, ssHeader);
        return true;
    }
    case RESTResponseFormat::HEX: {
        DataStream ssHeader{};
        for (const uint256& header : filter_headers) {
            ssHeader << header;
        }

        std::string strHex = HexStr(ssHeader) + "\n";
        req->WriteHeader("Content-Type", "text/plain");
        req->WriteReply(HTTP_OK, strHex);
        return true;
    }
    case RESTResponseFormat::JSON: {
        UniValue jsonHeaders(UniValue::VARR);
        for (const uint256& header : filter_headers) {
            jsonHeaders.push_back(header.GetHex());
        }

        std::string strJSON = jsonHeaders.write() + "\n";
        req->WriteHeader("Content-Type", "application/json");
        req->WriteReply(HTTP_OK, strJSON);
        return true;
    }
    default: {
        return RESTERR(req, HTTP_NOT_FOUND, "output format not found (available: " + AvailableDataFormatsString() + ")");
    }
    }
}